

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void container_add_offset
               (container_t *c,uint8_t type,container_t **lo,container_t **hi,uint16_t offset)

{
  char in_SIL;
  undefined8 in_RDI;
  undefined6 unaff_retaddr;
  undefined7 in_stack_00000018;
  uint16_t offset_00;
  
  offset_00 = (uint16_t)((ulong)in_RDI >> 0x30);
  if (in_SIL == '\x01') {
    bitset_container_offset
              ((bitset_container_t *)lo,hi,(container_t **)CONCAT26(offset,unaff_retaddr),offset_00)
    ;
  }
  else if (in_SIL == '\x02') {
    array_container_offset
              ((array_container_t *)lo,hi,(container_t **)CONCAT26(offset,unaff_retaddr),offset_00);
  }
  else {
    run_container_offset
              ((run_container_t *)c,(container_t **)CONCAT17(type,in_stack_00000018),lo,hi._6_2_);
  }
  return;
}

Assistant:

static inline void container_add_offset(const container_t *c, uint8_t type,
                                        container_t **lo, container_t **hi,
                                        uint16_t offset) {
    assert(offset != 0);
    assert(container_nonzero_cardinality(c, type));
    assert(lo != NULL || hi != NULL);
    assert(lo == NULL || *lo == NULL);
    assert(hi == NULL || *hi == NULL);

    switch (type) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_offset(const_CAST_bitset(c), lo, hi, offset);
            break;
        case ARRAY_CONTAINER_TYPE:
            array_container_offset(const_CAST_array(c), lo, hi, offset);
            break;
        case RUN_CONTAINER_TYPE:
            run_container_offset(const_CAST_run(c), lo, hi, offset);
            break;
        default:
            assert(false);
            roaring_unreachable;
            break;
    }
}